

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matching.cc
# Opt level: O2

int features::Matching::count_consistent_matches(Result *matches)

{
  pointer piVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  piVar1 = (matches->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(matches->matches_1_2).super__Vector_base<int,_std::allocator<int>_>._M_impl
                        .super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  iVar2 = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    lVar6 = (long)piVar1[uVar5];
    if (lVar6 != -1) {
      iVar2 = iVar2 + (uint)(uVar5 == (uint)(matches->matches_2_1).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar6]);
    }
  }
  return iVar2;
}

Assistant:

int
Matching::count_consistent_matches (Matching::Result const& matches)
{
    int counter = 0;
    for (int i = 0; i < static_cast<int>(matches.matches_1_2.size()); ++i)
        if (matches.matches_1_2[i] != -1
            && matches.matches_2_1[matches.matches_1_2[i]] == i)
            counter++;
    return counter;
}